

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O3

size_t __thiscall BamTools::Internal::BgzfStream::DeflateBlock(BgzfStream *this,int32_t blockLength)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  BamException *pBVar7;
  int iVar8;
  ulong uVar9;
  size_t __n;
  string local_e8;
  string local_c8;
  char *local_a8;
  string local_a0;
  undefined4 local_80;
  long local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_a8 = (this->m_compressedBlock).Buffer;
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  __n = 0;
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0] = '\x1f';
  local_a8[1] = -0x75;
  local_a8[2] = '\b';
  local_a8[3] = '\x04';
  local_a8[9] = -1;
  local_a8[10] = '\x06';
  local_a8[0xc] = 'B';
  local_a8[0xd] = 'C';
  local_a8[0xe] = '\x02';
  bVar2 = this->m_isWriteCompressed;
  pcVar1 = local_a8 + 0x12;
  uVar9 = (ulong)(uint)blockLength;
  while( true ) {
    local_60 = 0;
    uStack_58 = 0;
    local_a0._M_dataplus._M_p = (this->m_uncompressedBlock).Buffer;
    iVar8 = (int)uVar9;
    local_80 = 0xffe6;
    local_a0._M_string_length._0_4_ = iVar8;
    local_a0.field_2._8_8_ = pcVar1;
    iVar4 = deflateInit2_(&local_a0,-(uint)bVar2,8,0xfffffff1,8,0,"1.2.11",0x70);
    if (iVar4 != 0) {
      pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"BgzfStream::DeflateBlock","");
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"zlib deflateInit2 failed","");
      BamException::BamException(pBVar7,&local_e8,&local_c8);
      __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
    }
    iVar4 = deflate(&local_a0,4);
    iVar5 = deflateEnd(&local_a0);
    pcVar3 = local_a8;
    if (iVar4 != 0) break;
    if (iVar8 < 0x400) {
      pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"BgzfStream::DeflateBlock","");
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"input reduction failed","");
      BamException::BamException(pBVar7,&local_e8,&local_c8);
      __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
    }
    uVar9 = uVar9 - 0x400;
    __n = __n + 0x400;
  }
  if (iVar4 != 1) {
    pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"BgzfStream::DeflateBlock","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"zlib deflate failed","");
    BamException::BamException(pBVar7,&local_e8,&local_c8);
    __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
  }
  if (iVar5 == 0) {
    if (0x10000 < local_78 + 0x1aU) {
      pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"BgzfStream::DeflateBlock","");
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"deflate overflow","");
      BamException::BamException(pBVar7,&local_e8,&local_c8);
      __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
    }
    *(short *)(local_a8 + 0x10) = (short)local_78 + 0x19;
    uVar6 = crc32(0,0,0);
    uVar6 = crc32(uVar6,(this->m_uncompressedBlock).Buffer,uVar9 & 0xffffffff);
    pcVar3[local_78 + 0x12] = (char)uVar6;
    pcVar3[local_78 + 0x13] = (char)((uint)uVar6 >> 8);
    pcVar3[local_78 + 0x14] = (char)((uint)uVar6 >> 0x10);
    pcVar3[local_78 + 0x15] = (char)((uint)uVar6 >> 0x18);
    pcVar3[local_78 + 0x16] = (char)uVar9;
    pcVar3[local_78 + 0x17] = (char)(uVar9 >> 8);
    pcVar3[local_78 + 0x18] = (char)(uVar9 >> 0x10);
    pcVar3[local_78 + 0x19] = (char)(uVar9 >> 0x18);
    iVar4 = (int)__n;
    if (0 < iVar4) {
      if (iVar8 < iVar4) {
        pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"BgzfStream::DeflateBlock","");
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"after deflate, remainder too large","");
        BamException::BamException(pBVar7,&local_a0,&local_e8);
        __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
      }
      pcVar1 = (this->m_uncompressedBlock).Buffer;
      memcpy(pcVar1,pcVar1 + uVar9,__n);
    }
    this->m_blockOffset = iVar4;
    return local_78 + 0x1aU;
  }
  pBVar7 = (BamException *)__cxa_allocate_exception(0x28);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BgzfStream::DeflateBlock","")
  ;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"zlib deflateEnd failed","");
  BamException::BamException(pBVar7,&local_e8,&local_c8);
  __cxa_throw(pBVar7,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

std::size_t BgzfStream::DeflateBlock(int32_t blockLength)
{

    // initialize the gzip header
    char* buffer = m_compressedBlock.Buffer;
    memset(buffer, 0, 18);
    buffer[0] = Constants::GZIP_ID1;
    buffer[1] = Constants::GZIP_ID2;
    buffer[2] = Constants::CM_DEFLATE;
    buffer[3] = Constants::FLG_FEXTRA;
    buffer[9] = Constants::OS_UNKNOWN;
    buffer[10] = Constants::BGZF_XLEN;
    buffer[12] = Constants::BGZF_ID1;
    buffer[13] = Constants::BGZF_ID2;
    buffer[14] = Constants::BGZF_LEN;

    // set compression level
    const int compressionLevel = (m_isWriteCompressed ? Z_DEFAULT_COMPRESSION : 0);

    // loop to retry for blocks that do not compress enough
    int inputLength = blockLength;
    std::size_t compressedLength = 0;
    const unsigned int bufferSize = Constants::BGZF_MAX_BLOCK_SIZE;

    while (true) {

        // initialize zstream values
        z_stream zs;
        zs.zalloc = NULL;
        zs.zfree = NULL;
        zs.next_in = (Bytef*)m_uncompressedBlock.Buffer;
        zs.avail_in = inputLength;
        zs.next_out = (Bytef*)&buffer[Constants::BGZF_BLOCK_HEADER_LENGTH];
        zs.avail_out =
            bufferSize - Constants::BGZF_BLOCK_HEADER_LENGTH - Constants::BGZF_BLOCK_FOOTER_LENGTH;

        // initialize the zlib compression algorithm
        int status = deflateInit2(&zs, compressionLevel, Z_DEFLATED, Constants::GZIP_WINDOW_BITS,
                                  Constants::Z_DEFAULT_MEM_LEVEL, Z_DEFAULT_STRATEGY);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateInit2 failed");

        // compress the data
        status = deflate(&zs, Z_FINISH);

        // if not at stream end
        if (status != Z_STREAM_END) {

            deflateEnd(&zs);

            // there was not enough space available in buffer
            // try to reduce the input length & re-start loop
            if (status == Z_OK) {
                inputLength -= 1024;
                if (inputLength < 0)
                    throw BamException("BgzfStream::DeflateBlock", "input reduction failed");
                continue;
            }

            throw BamException("BgzfStream::DeflateBlock", "zlib deflate failed");
        }

        // finalize the compression routine
        status = deflateEnd(&zs);
        if (status != Z_OK)
            throw BamException("BgzfStream::DeflateBlock", "zlib deflateEnd failed");

        // update compressedLength
        compressedLength = zs.total_out + Constants::BGZF_BLOCK_HEADER_LENGTH +
                           Constants::BGZF_BLOCK_FOOTER_LENGTH;
        if (compressedLength > Constants::BGZF_MAX_BLOCK_SIZE)
            throw BamException("BgzfStream::DeflateBlock", "deflate overflow");

        // quit while loop
        break;
    }

    // store the compressed length
    BamTools::PackUnsignedShort(&buffer[16], static_cast<uint16_t>(compressedLength - 1));

    // store the CRC32 checksum
    uint32_t crc = crc32(0, NULL, 0);
    crc = crc32(crc, (Bytef*)m_uncompressedBlock.Buffer, inputLength);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 8], crc);
    BamTools::PackUnsignedInt(&buffer[compressedLength - 4], inputLength);

    // ensure that we have less than a block of data left
    int remaining = blockLength - inputLength;
    if (remaining > 0) {
        if (remaining > inputLength)
            throw BamException("BgzfStream::DeflateBlock", "after deflate, remainder too large");
        memcpy(m_uncompressedBlock.Buffer, m_uncompressedBlock.Buffer + inputLength, remaining);
    }

    // update block data
    m_blockOffset = remaining;

    // return result
    return compressedLength;
}